

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::stopAubCapture(CLIntercept *this,cl_command_queue command_queue)

{
  mutex *__mutex;
  __useconds_t __useconds;
  undefined8 uVar1;
  int iVar2;
  double __x;
  _cl_command_queue *local_38;
  long local_30;
  _cl_command_queue local_28 [16];
  
  if (this->m_AubCaptureStarted == true) {
    __mutex = &this->m_Mutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar1 = std::__throw_system_error(iVar2);
      if (local_38 != command_queue) {
        operator_delete(local_38);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar1);
    }
    if (this->m_AubCaptureStarted == true) {
      if (command_queue != (cl_command_queue)0x0) {
        (*(this->m_Dispatch).clFinish)(command_queue);
      }
      __useconds = (this->m_Config).AubCaptureEndWait;
      if (__useconds != 0) {
        usleep(__useconds);
      }
      local_30 = 0;
      local_28[0] = (_cl_command_queue)0x0;
      local_38 = local_28;
      iVar2 = setenv("AUBDumpToggleCaptureOnOff","0",1);
      if (iVar2 == 0) {
        if (local_30 == 0) {
          unsetenv("AUBDumpToggleFileName");
        }
        else {
          setenv("AUBDumpToggleFileName",(char *)local_38,1);
        }
      }
      if (local_38 != local_28) {
        operator_delete(local_38);
      }
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"AubCapture stopped.\n","");
      log(this,__x);
      if (local_38 != local_28) {
        operator_delete(local_38);
      }
      this->m_AubCaptureStarted = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::stopAubCapture(
    cl_command_queue command_queue )
{
    if( m_AubCaptureStarted == true )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_AubCaptureStarted == true )
        {
            if( command_queue )
            {
                dispatch().clFinish( command_queue );
            }

#if defined(_WIN32)
            if( m_Config.AubCaptureKDC )
            {
                OS().StopAubCaptureKDC(
                    config().AubCaptureEndWait );
            }
            else
#endif
            {
                OS().StopAubCapture(
                    config().AubCaptureEndWait );
            }
            log( "AubCapture stopped.\n" );

            // No matter what, clar the flag that aubcapture is started, so we
            // don't try again.
            m_AubCaptureStarted = false;
        }
    }
}